

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  ushort *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  FSE_DTableHeader *DTableH;
  void *ptr;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t value;
  U32 regMask;
  BIT_DStream_t *in_stack_ffffffffffffff68;
  uint local_64;
  
  uVar2 = in_RSI[1];
  bVar1 = (byte)*in_RDX;
  *(uint *)(in_RSI + 1) = (uint)*in_RDX + (int)in_RSI[1];
  *in_RDI = *in_RSI >> (('@' - (char)(int)uVar2) - bVar1 & 0x3f) & (1L << (bVar1 & 0x3f)) - 1U;
  if ((uint)in_RSI[1] < 0x41) {
    if (in_RSI[2] < in_RSI[4]) {
      if (in_RSI[2] != in_RSI[3]) {
        local_64 = (uint)in_RSI[1] >> 3;
        if (in_RSI[2] - (ulong)local_64 < in_RSI[3]) {
          local_64 = (int)in_RSI[2] - (int)in_RSI[3];
        }
        in_RSI[2] = in_RSI[2] - (ulong)local_64;
        *(uint *)(in_RSI + 1) = (int)in_RSI[1] + local_64 * -8;
        sVar3 = MEM_readLEST(in_stack_ffffffffffffff68);
        *in_RSI = sVar3;
      }
    }
    else {
      BIT_reloadDStreamFast(in_stack_ffffffffffffff68);
    }
  }
  in_RDI[1] = (ulong)(in_RDX + 2);
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}